

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void ImGui::DockContextQueueUndockNode(ImGuiContext_conflict1 *ctx,ImGuiDockNode *node)

{
  int *piVar1;
  ImVector<ImGuiDockRequest> *pIVar2;
  int iVar3;
  ImGuiDockRequest *pIVar4;
  ImGuiDockRequest *__dest;
  int iVar5;
  int iVar6;
  uint uStack_3c;
  
  iVar6 = (ctx->DockContext).Requests.Size;
  iVar3 = (ctx->DockContext).Requests.Capacity;
  if (iVar6 == iVar3) {
    iVar6 = iVar6 + 1;
    if (iVar3 == 0) {
      iVar5 = 8;
    }
    else {
      iVar5 = iVar3 / 2 + iVar3;
    }
    if (iVar6 < iVar5) {
      iVar6 = iVar5;
    }
    if (iVar3 < iVar6) {
      if (GImGui != (ImGuiContext_conflict1 *)0x0) {
        piVar1 = &(GImGui->IO).MetricsActiveAllocations;
        *piVar1 = *piVar1 + 1;
      }
      __dest = (ImGuiDockRequest *)(*GImAllocatorAllocFunc)((long)iVar6 << 6,GImAllocatorUserData);
      pIVar4 = (ctx->DockContext).Requests.Data;
      if (pIVar4 != (ImGuiDockRequest *)0x0) {
        memcpy(__dest,pIVar4,(long)(ctx->DockContext).Requests.Size << 6);
        pIVar4 = (ctx->DockContext).Requests.Data;
        if ((pIVar4 != (ImGuiDockRequest *)0x0) && (GImGui != (ImGuiContext_conflict1 *)0x0)) {
          piVar1 = &(GImGui->IO).MetricsActiveAllocations;
          *piVar1 = *piVar1 + -1;
        }
        (*GImAllocatorFreeFunc)(pIVar4,GImAllocatorUserData);
      }
      (ctx->DockContext).Requests.Data = __dest;
      (ctx->DockContext).Requests.Capacity = iVar6;
    }
  }
  pIVar4 = (ctx->DockContext).Requests.Data;
  iVar6 = (ctx->DockContext).Requests.Size;
  pIVar4[iVar6].Type = ImGuiDockRequestType_Undock;
  *(ulong *)&pIVar4[iVar6].field_0x4 = (ulong)uStack_3c;
  *(undefined8 *)(&pIVar4[iVar6].field_0x4 + 8) = 0;
  pIVar4[iVar6].DockTargetNode = (ImGuiDockNode *)0x0;
  (&pIVar4[iVar6].DockTargetNode)[1] = (ImGuiDockNode *)0x0;
  pIVar4[iVar6].DockSplitDir = -1;
  pIVar4[iVar6].DockSplitRatio = 0.5;
  pIVar4[iVar6].DockSplitOuter = false;
  pIVar4[iVar6].UndockTargetWindow = (ImGuiWindow_conflict *)0x0;
  pIVar4[iVar6].UndockTargetNode = node;
  pIVar2 = &(ctx->DockContext).Requests;
  pIVar2->Size = pIVar2->Size + 1;
  return;
}

Assistant:

void ImGui::DockContextQueueUndockNode(ImGuiContext* ctx, ImGuiDockNode* node)
{
    ImGuiDockRequest req;
    req.Type = ImGuiDockRequestType_Undock;
    req.UndockTargetNode = node;
    ctx->DockContext.Requests.push_back(req);
}